

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O2

void glcts::configureTexture<float>
               (Context *context,GLuint *id,GLuint width,GLuint height,GLuint depth,
               STORAGE_TYPE storType,GLenum internalFormat,GLenum format,GLenum type,float *data)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  char *msg;
  long lVar3;
  
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 8))(0x84c0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error setting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x10d);
  (**(code **)(lVar3 + 0x6f8))(1,id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x110);
  (**(code **)(lVar3 + 0xb8))(0x9009,*id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x113);
  (**(code **)(lVar3 + 0x1360))(0x9009,0x2800,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error setting texture object\'s filter mode!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x116);
  (**(code **)(lVar3 + 0x1360))(0x9009,0x2801,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error setting texture object\'s filter mode!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x118);
  if (storType == ST_MUTABLE) {
    (**(code **)(lVar3 + 0x1360))(0x9009,0x813c,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error setting texture parameter.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x11e);
    (**(code **)(lVar3 + 0x1360))(0x9009,0x813d,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error setting texture parameter.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x120);
    (**(code **)(lVar3 + 0x1320))
              (0x9009,0,internalFormat,width,CONCAT44(in_register_0000000c,height),depth,0,format,
               type,data);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    msg = "Error allocating texture object\'s data store";
    iVar1 = 0x123;
  }
  else {
    (**(code **)(lVar3 + 0x1398))(0x9009,1,internalFormat,width,height,depth);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error allocating texture object\'s data store",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x129);
    (**(code **)(lVar3 + 0x13c0))
              (0x9009,0,0,0,0,width,CONCAT44(in_register_0000000c,height),depth,format,type,data);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    msg = "Error filling texture object\'s data store with data";
    iVar1 = 300;
  }
  glu::checkError(dVar2,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,iVar1);
  return;
}

Assistant:

void configureTexture(glcts::Context& context, glw::GLuint* id, glw::GLuint width, glw::GLuint height,
					  glw::GLuint depth, STORAGE_TYPE storType, glw::GLenum internalFormat, glw::GLenum format,
					  glw::GLenum type, const T* data)
{
	/* Get GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Generate texture object */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");

	gl.genTextures(1, id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, *id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");

	/* used glTexImage3D() method if texture should be MUTABLE */
	if (storType == ST_MUTABLE)
	{
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_BASE_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture parameter.");
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAX_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture parameter.");

		gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, internalFormat, width, height, depth, 0, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating texture object's data store");
	}
	/* used glTexStorage3D() method if texture should be IMMUTABLE */
	else
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 1, internalFormat, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating texture object's data store");

		gl.texSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 0, 0, 0, width, height, depth, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture object's data store with data");
	}
}